

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O0

void anon_unknown.dwarf_239dcf::writeCopyReadONE
               (char *fileName1,char *fileName2,int width,int height,int xSize,int ySize,int xOffset
               ,int yOffset,Compression comp,LevelRoundingMode rmode)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  void *this;
  int *piVar6;
  undefined4 *puVar7;
  char *pcVar8;
  half *phVar9;
  Header *pHVar10;
  float *pfVar11;
  Vec2<float> *this_00;
  Vec2<float> *v;
  ChannelList *this_01;
  ChannelList *pCVar12;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  uint in_R8D;
  uint in_R9D;
  float fVar13;
  float fVar14;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  LevelRoundingMode in_stack_00000020;
  int x;
  int y;
  FrameBuffer fb2;
  FrameBuffer fb1;
  Array2D<Imath_3_2::half> ph2;
  Array2D<Imath_3_2::half> ph1_1;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  TiledInputFile in2;
  TiledInputFile in1;
  TiledOutputFile out_1;
  InputFile in;
  TiledOutputFile out;
  FrameBuffer fb;
  Array2D<Imath_3_2::half> ph1;
  Header hdr;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffab4;
  int in_stack_fffffffffffffab8;
  undefined4 uVar16;
  int in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  int local_310;
  int local_30c;
  Slice local_308 [56];
  Slice local_2d0 [56];
  char local_298 [48];
  char local_268 [48];
  Array2D<Imath_3_2::half> local_238;
  Array2D<Imath_3_2::half> local_220;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int *local_1f8;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [64];
  InputFile local_190 [32];
  undefined1 local_170 [88];
  char local_118 [48];
  Array2D<Imath_3_2::half> local_e8;
  TileDescription local_cc;
  Channel local_bc [28];
  Vec2<float> local_a0;
  Vec2<int> local_98;
  Vec2<int> local_90;
  Box local_88 [16];
  Vec2<int> local_78;
  Vec2<int> local_70;
  Box local_68 [16];
  TileDescription local_58 [3];
  uint local_20;
  uint local_1c;
  int local_18;
  int local_14;
  char *local_10;
  char *local_8;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"levelMode 0, ");
  poVar5 = std::operator<<(poVar5,"compression ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000018);
  poVar5 = std::operator<<(poVar5,", roundingMode ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000020);
  poVar5 = std::operator<<(poVar5,", xOffset ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000008);
  poVar5 = std::operator<<(poVar5,", yOffset ");
  this = (void *)std::ostream::operator<<(poVar5,in_stack_00000010);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<int>::Vec2(&local_70,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_78,local_14 + -1,local_18 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  Imath_3_2::Vec2<int>::Vec2(&local_90,in_stack_00000008,in_stack_00000010);
  Imath_3_2::Vec2<int>::Vec2
            (&local_98,in_stack_00000008 + -1 + local_14,in_stack_00000010 + -1 + local_18);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  Imath_3_2::Vec2<float>::Vec2(&local_a0,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_58,local_68,local_88,1.0,(Vec2 *)&local_a0,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  piVar6 = (int *)Imf_3_4::Header::compression();
  *piVar6 = in_stack_00000018;
  puVar7 = (undefined4 *)Imf_3_4::Header::lineOrder();
  *puVar7 = 0;
  pcVar8 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_bc,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar8,(Channel *)0x231e2f);
  Imf_3_4::TileDescription::TileDescription(&local_cc,local_1c,local_20,ONE_LEVEL,in_stack_00000020)
  ;
  Imf_3_4::Header::setTileDescription(local_58);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
             CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  fillPixels((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),in_stack_fffffffffffffabc
             ,in_stack_fffffffffffffab8);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x20b1d3);
  phVar9 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_e8,(long)-in_stack_00000010);
  uVar16 = 0;
  uVar15 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_170 + 0x20),HALF,(char *)(phVar9 + -in_stack_00000008),2,
             (long)local_14 * 2,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_118,(Slice *)0x231e2f);
  poVar5 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  remove(local_8);
  pcVar8 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)local_170,pcVar8,(Header *)local_58,iVar3);
  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_170);
  iVar3 = Imf_3_4::TiledOutputFile::numXTiles((int)local_170);
  iVar4 = Imf_3_4::TiledOutputFile::numYTiles((int)local_170);
  Imf_3_4::TiledOutputFile::writeTiles((int)local_170,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_170);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x20b38d);
  poVar5 = std::operator<<((ostream *)&std::cout," copying");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  remove(local_10);
  pcVar8 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_190,pcVar8,iVar3);
  pcVar8 = local_10;
  pHVar10 = (Header *)Imf_3_4::InputFile::header();
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)(local_1d0 + 0x20),pcVar8,pHVar10,iVar3);
  Imf_3_4::TiledOutputFile::copyPixels((InputFile *)(local_1d0 + 0x20));
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)(local_1d0 + 0x20));
  Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
  poVar5 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  pcVar8 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)local_1d0,pcVar8,iVar3);
  pcVar8 = local_10;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)local_1f0,pcVar8,iVar3);
  Imf_3_4::TiledInputFile::header();
  local_1f8 = (int *)Imf_3_4::Header::dataWindow();
  local_1fc = (local_1f8[2] - *local_1f8) + 1;
  local_200 = (local_1f8[3] - local_1f8[1]) + 1;
  local_204 = *local_1f8;
  local_208 = local_1f8[1];
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             CONCAT44(in_stack_fffffffffffffabc,uVar16),CONCAT44(in_stack_fffffffffffffab4,uVar15));
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             CONCAT44(in_stack_fffffffffffffabc,uVar16),CONCAT44(in_stack_fffffffffffffab4,uVar15));
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x20b61d);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x20b62a);
  phVar9 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_220,(long)-local_208);
  Imf_3_4::Slice::Slice
            (local_2d0,HALF,(char *)(phVar9 + -local_204),2,(long)local_1fc * 2,1,1,0.0,false,false)
  ;
  Imf_3_4::FrameBuffer::insert(local_268,(Slice *)0x231e2f);
  phVar9 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_238,(long)-local_208);
  uVar16 = 0;
  uVar15 = 0;
  Imf_3_4::Slice::Slice
            (local_308,HALF,(char *)(phVar9 + -local_204),2,(long)local_1fc * 2,1,1,0.0,false,false)
  ;
  Imf_3_4::FrameBuffer::insert(local_298,(Slice *)0x231e2f);
  Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)local_1d0);
  iVar3 = Imf_3_4::TiledInputFile::numXTiles((int)local_1d0);
  iVar4 = Imf_3_4::TiledInputFile::numYTiles((int)local_1d0);
  Imf_3_4::TiledInputFile::readTiles((int)local_1d0,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)local_1f0);
  iVar3 = Imf_3_4::TiledInputFile::numXTiles((int)local_1f0);
  iVar4 = Imf_3_4::TiledInputFile::numYTiles((int)local_1f0);
  Imf_3_4::TiledInputFile::readTiles((int)local_1f0,0,iVar3 + -1,0,iVar4 + -1);
  poVar5 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffabc,uVar16));
  if (!bVar1) {
    __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                  ,0x8d,
                  "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffabc,uVar16));
  if (!bVar1) {
    __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                  ,0x8e,
                  "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar11 = (float *)Imf_3_4::Header::pixelAspectRatio();
  fVar13 = *pfVar11;
  pfVar11 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar13 != *pfVar11) || (NAN(fVar13) || NAN(*pfVar11))) {
    __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                  ,0x8f,
                  "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  this_00 = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar1 = Imath_3_2::Vec2<float>::operator==(this_00,v);
  if (!bVar1) {
    __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                  ,0x91,
                  "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar11 = (float *)Imf_3_4::Header::screenWindowWidth();
  fVar13 = *pfVar11;
  pfVar11 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar13 == *pfVar11) && (!NAN(fVar13) && !NAN(*pfVar11))) {
    Imf_3_4::TiledInputFile::header();
    piVar6 = (int *)Imf_3_4::Header::lineOrder();
    iVar3 = *piVar6;
    piVar6 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar3 != *piVar6) {
      __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                    ,0x93,
                    "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                   );
    }
    Imf_3_4::TiledInputFile::header();
    piVar6 = (int *)Imf_3_4::Header::compression();
    iVar3 = *piVar6;
    piVar6 = (int *)Imf_3_4::Header::compression();
    if (iVar3 == *piVar6) {
      Imf_3_4::TiledInputFile::header();
      this_01 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar12 = (ChannelList *)Imf_3_4::Header::channels();
      bVar2 = Imf_3_4::ChannelList::operator==(this_01,pCVar12);
      if ((bVar2 & 1) == 0) {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x95,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      local_30c = 0;
      do {
        if (local_200 <= local_30c) {
          Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x20bf11);
          Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x20bf1e);
          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
          Imf_3_4::TiledInputFile::~TiledInputFile
                    ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
          Imf_3_4::TiledInputFile::~TiledInputFile
                    ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
          remove(local_8);
          remove(local_10);
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
          Imf_3_4::Header::~Header((Header *)local_58);
          return;
        }
        for (local_310 = 0; local_310 < local_1fc; local_310 = local_310 + 1) {
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_220,(long)local_30c);
          fVar13 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_238,(long)local_30c);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffab4,uVar15));
          if ((fVar13 != fVar14) || (NAN(fVar13) || NAN(fVar14))) {
            __assert_fail("ph1[y][x] == ph2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                          ,0x99,
                          "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                         );
          }
        }
        local_30c = local_30c + 1;
      } while( true );
    }
    __assert_fail("in2.header ().compression () == hdr.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                  ,0x94,
                  "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                ,0x92,
                "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
               );
}

Assistant:

void
writeCopyReadONE (
    const char        fileName1[],
    const char        fileName2[],
    int               width,
    int               height,
    int               xSize,
    int               ySize,
    int               xOffset,
    int               yOffset,
    Compression       comp,
    LevelRoundingMode rmode)
{
    cout << "levelMode 0, "
         << "compression " << comp << ", roundingMode " << rmode << ", xOffset "
         << xOffset << ", yOffset " << yOffset << endl;

    Header hdr (
        (Box2i (
            V2i (0, 0), // display window
            V2i (width - 1, height - 1))),
        (Box2i (
            V2i (xOffset, yOffset), // data window
            V2i (xOffset + width - 1, yOffset + height - 1))));

    hdr.compression () = comp;
    hdr.lineOrder ()   = INCREASING_Y;
    hdr.channels ().insert ("H", Channel (HALF, 1, 1));

    hdr.setTileDescription (TileDescription (xSize, ySize, ONE_LEVEL, rmode));

    Array2D<half> ph1 (height, width);
    fillPixels (ph1, width, height);

    {
        FrameBuffer fb;

        fb.insert (
            "H",
            Slice (
                HALF,
                (char*) &ph1[-yOffset][-xOffset],
                sizeof (ph1[0][0]),
                sizeof (ph1[0][0]) * width));

        cout << " writing" << flush;

        remove (fileName1);
        TiledOutputFile out (fileName1, hdr);
        out.setFrameBuffer (fb);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    {
        cout << " copying" << flush;

        remove (fileName2);
        InputFile       in (fileName1);
        TiledOutputFile out (fileName2, in.header ());
        out.copyPixels (in);
    }

    {
        cout << " reading" << flush;

        TiledInputFile in1 (fileName1);
        TiledInputFile in2 (fileName2);

        const Box2i& dw = in2.header ().dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<half> ph1 (h, w);
        Array2D<half> ph2 (h, w);

        FrameBuffer fb1;
        FrameBuffer fb2;

        fb1.insert (
            "H",
            Slice (
                HALF,
                (char*) &ph1[-dy][-dx],
                sizeof (ph1[0][0]),
                sizeof (ph1[0][0]) * w));

        fb2.insert (
            "H",
            Slice (
                HALF,
                (char*) &ph2[-dy][-dx],
                sizeof (ph2[0][0]),
                sizeof (ph2[0][0]) * w));

        in1.setFrameBuffer (fb1);
        in1.readTiles (0, in1.numXTiles () - 1, 0, in1.numYTiles () - 1);
        in2.setFrameBuffer (fb2);
        in2.readTiles (0, in2.numXTiles () - 1, 0, in2.numYTiles () - 1);

        cout << " comparing" << flush;

        assert (in2.header ().displayWindow () == hdr.displayWindow ());
        assert (in2.header ().dataWindow () == hdr.dataWindow ());
        assert (in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ());
        assert (
            in2.header ().screenWindowCenter () == hdr.screenWindowCenter ());
        assert (in2.header ().screenWindowWidth () == hdr.screenWindowWidth ());
        assert (in2.header ().lineOrder () == hdr.lineOrder ());
        assert (in2.header ().compression () == hdr.compression ());
        assert (in2.header ().channels () == hdr.channels ());

        for (int y = 0; y < h; ++y)
            for (int x = 0; x < w; ++x)
                assert (ph1[y][x] == ph2[y][x]);
    }

    remove (fileName1);
    remove (fileName2);
    cout << endl;
}